

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O2

void __thiscall
irr::video::COpenGLDriver::setBasicRenderStates
          (COpenGLDriver *this,SMaterial *material,SMaterial *lastmaterial,bool resetAllRenderStates
          )

{
  u8 uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  ushort uVar5;
  int iVar6;
  GLenum GVar7;
  GLenum GVar8;
  GLenum sourceAlpha;
  GLenum destinationAlpha;
  ushort uVar9;
  undefined7 in_register_00000009;
  E_BLEND_FACTOR factor;
  undefined4 uVar10;
  undefined8 uVar11;
  COpenGLCacheHandler *pCVar12;
  COpenGLDriver *this_00;
  long lVar13;
  f32 fVar14;
  float fVar15;
  f32 fVar16;
  E_OPENGL_FIXED_PIPELINE_STATE local_5c;
  GLfloat color [4];
  
  bVar4 = true;
  if (((int)CONCAT71(in_register_00000009,resetAllRenderStates) == 0) &&
     (local_5c = this->FixedPipelineState, local_5c != EOFPS_DISABLE_TO_ENABLE)) {
    if (local_5c != EOFPS_ENABLE_TO_DISABLE) {
      if (local_5c != EOFPS_ENABLE) goto LAB_002003c1;
      if (((*(ushort *)&material->field_0xa2 ^ *(ushort *)&lastmaterial->field_0xa2) & 0x70) != 0) {
        bVar4 = false;
        goto LAB_001ffe93;
      }
      goto LAB_001fff8a;
    }
    glDisable(0xb57);
    glDisable(0xb50);
    glDisable(0xb60);
    glDisable(0xba1);
    local_5c = EOFPS_DISABLE;
    goto LAB_002003c1;
  }
LAB_001ffe93:
  switch(*(ushort *)&material->field_0xa2 >> 4 & 7) {
  case 0:
    glDisable(0xb57);
    goto switchD_001ffeb8_default;
  case 1:
    uVar11 = 0x1201;
    break;
  case 2:
    uVar11 = 0x1200;
    break;
  case 3:
    uVar11 = 0x1600;
    break;
  case 4:
    uVar11 = 0x1202;
    break;
  case 5:
    uVar11 = 0x1602;
    break;
  default:
    goto switchD_001ffeb8_default;
  }
  glColorMaterial(0x408,uVar11);
switchD_001ffeb8_default:
  if ((material->field_0xa2 & 0x70) != 0) {
    glEnable(0xb57);
  }
  bVar3 = true;
  if (bVar4) {
LAB_001fffd8:
    uVar5 = *(ushort *)&material->field_0xa2;
    uVar9 = uVar5 >> 4 & 7;
    if ((uVar9 != 2) && (uVar9 != 5)) {
      uVar2 = (material->AmbientColor).color;
      color[1] = (float)(uVar2 >> 8 & 0xff) * 0.003921569;
      color[0] = (float)(uVar2 >> 0x10 & 0xff) * 0.003921569;
      color[3] = (float)(uVar2 >> 0x18) * 0.003921569;
      color[2] = (float)(uVar2 & 0xff) * 0.003921569;
      glMaterialfv(0x408,0x1200);
      uVar5 = *(ushort *)&material->field_0xa2;
      uVar9 = uVar5 >> 4 & 7;
    }
    if ((uVar9 | 4) != 5) {
      uVar2 = (material->DiffuseColor).color;
      color[1] = (float)(uVar2 >> 8 & 0xff) * 0.003921569;
      color[0] = (float)(uVar2 >> 0x10 & 0xff) * 0.003921569;
      color[3] = (float)(uVar2 >> 0x18) * 0.003921569;
      color[2] = (float)(uVar2 & 0xff) * 0.003921569;
      glMaterialfv(0x408,0x1201);
      uVar5 = *(ushort *)&material->field_0xa2;
    }
    if ((uVar5 & 0x70) != 0x30) {
      uVar2 = (material->EmissiveColor).color;
      color[1] = (float)(uVar2 >> 8 & 0xff) * 0.003921569;
      color[0] = (float)(uVar2 >> 0x10 & 0xff) * 0.003921569;
      color[3] = (float)(uVar2 >> 0x18) * 0.003921569;
      color[2] = (float)(uVar2 & 0xff) * 0.003921569;
      glMaterialfv(0x408,0x1600);
    }
    bVar4 = true;
    if (!bVar3) goto LAB_00200174;
LAB_002001b7:
    color[0] = 0.0;
    color[1] = 0.0;
    color[2] = 0.0;
    color[3] = 1.0;
    glMaterialf(material->Shininess,0x408,0x1601);
    if ((((float)material->Shininess == 0.0) && (!NAN((float)material->Shininess))) ||
       ((*(ushort *)&material->field_0xa2 & 0x70) == 0x40)) {
      if (this->field_0x5d7 == '\x01') {
        glLightModeli(0x81f8,0x81f9);
      }
    }
    else {
      if (this->field_0x5d7 == '\x01') {
        glLightModeli(0x81f8,0x81fa);
      }
      uVar2 = (material->SpecularColor).color;
      color[1] = (float)(uVar2 >> 8 & 0xff) * 0.003921569;
      color[0] = (float)(uVar2 >> 0x10 & 0xff) * 0.003921569;
      color[3] = (float)(uVar2 >> 0x18) * 0.003921569;
      color[2] = (float)(uVar2 & 0xff) * 0.003921569;
    }
    glMaterialfv(0x408,0x1202,color);
    if (!bVar4) goto LAB_002002ba;
    uVar5 = *(ushort *)&material->field_0xb0;
    bVar4 = true;
LAB_002002d6:
    if ((uVar5 & 4) == 0) {
      uVar11 = 0x1d00;
    }
    else {
      uVar11 = 0x1d01;
    }
    glShadeModel(uVar11);
    bVar3 = true;
    if (!bVar4) goto LAB_002002f3;
LAB_0020030a:
    if ((material->field_0xb0 & 8) == 0) {
      glDisable(0xb50);
    }
    else {
      glEnable(0xb50);
    }
    bVar4 = true;
    if (!bVar3) goto LAB_00200332;
LAB_0020034c:
    if ((material->field_0xb1 & 1) == 0) {
      glDisable(0xb60);
    }
    else {
      glEnable(0xb60);
    }
    if (!bVar4) goto LAB_00200371;
LAB_00200388:
    if ((material->field_0xb1 & 2) == 0) {
      glDisable(0xba1);
    }
    else {
      glEnable(0xba1);
    }
  }
  else {
LAB_001fff8a:
    if (((((material->AmbientColor).color != (lastmaterial->AmbientColor).color) ||
         ((material->DiffuseColor).color != (lastmaterial->DiffuseColor).color)) ||
        ((material->EmissiveColor).color != (lastmaterial->EmissiveColor).color)) ||
       (((*(ushort *)&material->field_0xa2 ^ *(ushort *)&lastmaterial->field_0xa2) & 0x70) != 0)) {
      bVar3 = false;
      goto LAB_001fffd8;
    }
LAB_00200174:
    if ((((material->SpecularColor).color != (lastmaterial->SpecularColor).color) ||
        ((float)lastmaterial->Shininess != (float)material->Shininess)) ||
       ((NAN((float)lastmaterial->Shininess) || NAN((float)material->Shininess) ||
        (((*(ushort *)&material->field_0xa2 ^ *(ushort *)&lastmaterial->field_0xa2) & 0x70) != 0))))
    {
      bVar4 = false;
      goto LAB_002001b7;
    }
LAB_002002ba:
    uVar5 = *(ushort *)&material->field_0xb0;
    if (((*(ushort *)&lastmaterial->field_0xb0 ^ uVar5) & 4) != 0) {
      bVar4 = false;
      goto LAB_002002d6;
    }
LAB_002002f3:
    if (((*(ushort *)&material->field_0xb0 ^ *(ushort *)&lastmaterial->field_0xb0) & 8) != 0) {
      bVar3 = false;
      goto LAB_0020030a;
    }
LAB_00200332:
    if (((*(ushort *)&material->field_0xb0 ^ *(ushort *)&lastmaterial->field_0xb0) >> 8 & 1) != 0) {
      bVar4 = false;
      goto LAB_0020034c;
    }
LAB_00200371:
    if (((*(ushort *)&material->field_0xb0 ^ *(ushort *)&lastmaterial->field_0xb0) >> 9 & 1) != 0)
    goto LAB_00200388;
  }
  local_5c = EOFPS_ENABLE;
  if (resetAllRenderStates) {
    uVar5 = *(ushort *)&material->field_0xb0;
    local_5c = EOFPS_ENABLE;
LAB_002003de:
    iVar6 = 0x1b01;
    if ((uVar5 & 1) == 0) {
      iVar6 = (uint)((uVar5 & 2) == 0) * 2 + 0x1b00;
    }
    glPolygonMode(0x408,iVar6);
  }
  else {
LAB_002003c1:
    uVar5 = *(ushort *)&material->field_0xb0;
    if (((*(ushort *)&lastmaterial->field_0xb0 ^ uVar5) & 3) != 0) goto LAB_002003de;
  }
  switch(material->ZBuffer) {
  case '\0':
    pCVar12 = this->CacheHandler;
    if ((pCVar12->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthTest != false) {
      (*GL.Disable)(0xb71);
      (pCVar12->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthTest = false;
    }
    break;
  case '\x01':
    pCVar12 = this->CacheHandler;
    if ((pCVar12->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthTest == false) {
      (*GL.Enable)(0xb71);
      (pCVar12->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthTest = true;
      pCVar12 = this->CacheHandler;
    }
    if ((pCVar12->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthFunc != 0x203) {
      (*GL.DepthFunc)(0x203);
      (pCVar12->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthFunc = 0x203;
    }
    break;
  case '\x02':
    pCVar12 = this->CacheHandler;
    if ((pCVar12->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthTest == false) {
      (*GL.Enable)(0xb71);
      (pCVar12->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthTest = true;
      pCVar12 = this->CacheHandler;
    }
    if ((pCVar12->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthFunc != 0x202) {
      (*GL.DepthFunc)(0x202);
      (pCVar12->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthFunc = 0x202;
    }
    break;
  case '\x03':
    pCVar12 = this->CacheHandler;
    if ((pCVar12->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthTest == false) {
      (*GL.Enable)(0xb71);
      (pCVar12->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthTest = true;
      pCVar12 = this->CacheHandler;
    }
    if ((pCVar12->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthFunc != 0x201) {
      (*GL.DepthFunc)(0x201);
      (pCVar12->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthFunc = 0x201;
    }
    break;
  case '\x04':
    pCVar12 = this->CacheHandler;
    if ((pCVar12->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthTest == false) {
      (*GL.Enable)(0xb71);
      (pCVar12->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthTest = true;
      pCVar12 = this->CacheHandler;
    }
    if ((pCVar12->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthFunc != 0x205) {
      (*GL.DepthFunc)(0x205);
      (pCVar12->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthFunc = 0x205;
    }
    break;
  case '\x05':
    pCVar12 = this->CacheHandler;
    if ((pCVar12->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthTest == false) {
      (*GL.Enable)(0xb71);
      (pCVar12->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthTest = true;
      pCVar12 = this->CacheHandler;
    }
    if ((pCVar12->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthFunc != 0x206) {
      (*GL.DepthFunc)(0x206);
      (pCVar12->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthFunc = 0x206;
    }
    break;
  case '\x06':
    pCVar12 = this->CacheHandler;
    if ((pCVar12->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthTest == false) {
      (*GL.Enable)(0xb71);
      (pCVar12->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthTest = true;
      pCVar12 = this->CacheHandler;
    }
    if ((pCVar12->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthFunc != 0x204) {
      (*GL.DepthFunc)(0x204);
      (pCVar12->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthFunc = 0x204;
    }
    break;
  case '\a':
    pCVar12 = this->CacheHandler;
    if ((pCVar12->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthTest == false) {
      (*GL.Enable)(0xb71);
      (pCVar12->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthTest = true;
      pCVar12 = this->CacheHandler;
    }
    if ((pCVar12->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthFunc != 0x207) {
      (*GL.DepthFunc)(0x207);
      (pCVar12->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthFunc = 0x207;
    }
    break;
  case '\b':
    pCVar12 = this->CacheHandler;
    if ((pCVar12->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthTest == false) {
      (*GL.Enable)(0xb71);
      (pCVar12->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthTest = true;
      pCVar12 = this->CacheHandler;
    }
    if ((pCVar12->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthFunc != 0x200) {
      (*GL.DepthFunc)(0x200);
      (pCVar12->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthFunc = 0x200;
    }
  }
  bVar3 = CNullDriver::getWriteZBuffer(&this->super_CNullDriver,material);
  pCVar12 = this->CacheHandler;
  bVar4 = (pCVar12->
          super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
          ).DepthMask;
  if (bVar3) {
    if (bVar4 == false) {
      bVar4 = true;
LAB_00200799:
      (*GL.DepthMask)(bVar4);
      (pCVar12->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthMask = bVar4;
    }
  }
  else if (bVar4 != false) {
    bVar4 = false;
    goto LAB_00200799;
  }
  uVar2 = *(uint *)&material->field_0xb0;
  if ((~uVar2 & 0xc0) == 0) {
    pCVar12 = this->CacheHandler;
    if ((pCVar12->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).CullFaceMode != 0x408) {
      (*GL.CullFace)(0x408);
      (pCVar12->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).CullFaceMode = 0x408;
LAB_00200882:
      pCVar12 = this->CacheHandler;
    }
LAB_00200889:
    if ((pCVar12->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).CullFace == false) {
      (*GL.Enable)(0xb44);
      (pCVar12->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).CullFace = true;
    }
  }
  else {
    pCVar12 = this->CacheHandler;
    if ((uVar2 & 0x40) != 0) {
      if ((pCVar12->
          super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
          ).CullFaceMode != 0x405) {
        (*GL.CullFace)(0x405);
        (pCVar12->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).CullFaceMode = 0x405;
        goto LAB_00200882;
      }
      goto LAB_00200889;
    }
    if ((char)uVar2 < '\0') {
      if ((pCVar12->
          super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
          ).CullFaceMode != 0x404) {
        (*GL.CullFace)(0x404);
        (pCVar12->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).CullFaceMode = 0x404;
        goto LAB_00200882;
      }
      goto LAB_00200889;
    }
    if ((pCVar12->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).CullFace != false) {
      (*GL.Disable)(0xb44);
      (pCVar12->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).CullFace = false;
    }
  }
  COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
  ::setColorMask(&this->CacheHandler->
                  super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                 ,(byte)*(undefined2 *)&material->field_0xa2 & 0xf);
  if ((*(ushort *)&material->field_0xa2 & 0x780) == 0) {
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setBlend(&this->CacheHandler->
                super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
               ,false);
  }
  else {
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setBlend(&this->CacheHandler->
                super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
               ,true);
    iVar6 = (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[2])(this,0x21);
    if ((char)iVar6 != '\0') {
      switch(*(ushort *)&material->field_0xa2 >> 7 & 0xf) {
      case 2:
        pCVar12 = this->CacheHandler;
        GVar7 = 0x800a;
        break;
      case 3:
        pCVar12 = this->CacheHandler;
        GVar7 = 0x800b;
        break;
      case 4:
switchD_00200922_caseD_4:
        pCVar12 = this->CacheHandler;
LAB_002009e7:
        GVar7 = 0x8007;
        break;
      case 5:
switchD_00200922_caseD_5:
        pCVar12 = this->CacheHandler;
LAB_002009d0:
        GVar7 = 0x8008;
        break;
      case 6:
        pCVar12 = this->CacheHandler;
        if (this->field_0x4d9 != '\x01') goto LAB_002009e7;
        GVar7 = 0x901c;
        break;
      case 7:
        pCVar12 = this->CacheHandler;
        if (this->field_0x4d9 != '\x01') goto LAB_002009d0;
        GVar7 = 0x901d;
        break;
      case 8:
        if (this->field_0x687 != '\x01') {
          if (this->field_0x5a7 != '\x01') goto LAB_002009f1;
          goto switchD_00200922_caseD_4;
        }
        pCVar12 = this->CacheHandler;
        GVar7 = 0x8320;
        break;
      case 9:
        if (this->field_0x687 != '\x01') {
          if (this->field_0x5a7 != '\x01') goto LAB_002009f1;
          goto switchD_00200922_caseD_5;
        }
        pCVar12 = this->CacheHandler;
        GVar7 = 0x8321;
        break;
      default:
        pCVar12 = this->CacheHandler;
        GVar7 = 0x8006;
      }
      COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::setBlendEquation(&pCVar12->
                          super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                         ,GVar7);
    }
  }
LAB_002009f1:
  fVar14 = material->BlendFactor;
  if ((fVar14 != 0.0) && (material->MaterialType != EMT_ONETEXTURE_BLEND)) {
    factor = (uint)fVar14 >> 4 & (EBF_DST_ALPHA|EBF_ONE_MINUS_SRC_ALPHA);
    this_00 = this;
    iVar6 = (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[2])(this,0x22);
    if ((char)iVar6 == '\0') {
      pCVar12 = this->CacheHandler;
      GVar7 = getGLBlend(this_00,factor);
      GVar8 = getGLBlend(this_00,(uint)fVar14 & (EBF_DST_ALPHA|EBF_ONE_MINUS_SRC_ALPHA));
      COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::setBlendFunc(&pCVar12->
                      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                     ,GVar7,GVar8);
    }
    else {
      pCVar12 = this->CacheHandler;
      GVar7 = getGLBlend(this_00,factor);
      GVar8 = getGLBlend(this_00,(uint)fVar14 & (EBF_DST_ALPHA|EBF_ONE_MINUS_SRC_ALPHA));
      sourceAlpha = getGLBlend(this_00,(uint)fVar14 >> 0xc & (EBF_DST_ALPHA|EBF_ONE_MINUS_SRC_ALPHA)
                              );
      destinationAlpha =
           getGLBlend(this_00,(uint)fVar14 >> 8 & (EBF_DST_ALPHA|EBF_ONE_MINUS_SRC_ALPHA));
      COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::setBlendFuncSeparate
                (&pCVar12->
                  super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                 ,GVar7,GVar8,sourceAlpha,destinationAlpha);
    }
  }
  iVar6 = (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[2])(this,0x20);
  if ((char)iVar6 == '\0') {
LAB_00200b92:
    if (!resetAllRenderStates) goto LAB_00200b9c;
LAB_00200bb2:
    uVar1 = this->AntiAlias;
    fVar15 = *(float *)&this->field_0x4b8;
    if (*(float *)&this->field_0x4b8 <= (float)material->Thickness) {
      fVar15 = (float)material->Thickness;
    }
    if (*(float *)&this->field_0x4bc <= fVar15) {
      fVar15 = *(float *)&this->field_0x4bc;
    }
    glPointSize(fVar15);
    lVar13 = (ulong)(uVar1 != '\0') * 0x10;
    fVar15 = *(float *)(&this->field_0x4b0 + lVar13);
    if (*(float *)(&this->field_0x4b0 + lVar13) <= (float)material->Thickness) {
      fVar15 = (float)material->Thickness;
    }
    if (*(float *)(&this->field_0x4b4 + lVar13) <= fVar15) {
      fVar15 = *(float *)(&this->field_0x4b4 + lVar13);
    }
    glLineWidth(fVar15);
    if (!resetAllRenderStates) goto LAB_00200c09;
  }
  else {
    if (((resetAllRenderStates) ||
        ((float)lastmaterial->PolygonOffsetSlopeScale != (float)material->PolygonOffsetSlopeScale))
       || (NAN((float)lastmaterial->PolygonOffsetSlopeScale) ||
           NAN((float)material->PolygonOffsetSlopeScale))) {
LAB_00200b08:
      uVar10 = 0x2a01;
      if ((*(ushort *)&lastmaterial->field_0xb0 & 2) == 0) {
        uVar10 = 0x8037;
      }
      if ((*(ushort *)&lastmaterial->field_0xb0 & 1) != 0) {
        uVar10 = 0x2a02;
      }
      glDisable(uVar10);
      fVar14 = 0.0;
      if (((((float)material->PolygonOffsetSlopeScale != 0.0) ||
           (NAN((float)material->PolygonOffsetSlopeScale))) ||
          ((float)material->PolygonOffsetDepthBias != 0.0)) ||
         (NAN((float)material->PolygonOffsetDepthBias))) {
        uVar10 = 0x2a01;
        if ((*(ushort *)&material->field_0xb0 & 2) == 0) {
          uVar10 = 0x8037;
        }
        if ((*(ushort *)&material->field_0xb0 & 1) != 0) {
          uVar10 = 0x2a02;
        }
        glEnable(uVar10);
        fVar16 = material->PolygonOffsetDepthBias;
        fVar14 = material->PolygonOffsetSlopeScale;
      }
      else {
        fVar16 = 0.0;
      }
      glPolygonOffset(fVar14,fVar16);
      goto LAB_00200b92;
    }
    if (((float)lastmaterial->PolygonOffsetDepthBias != (float)material->PolygonOffsetDepthBias) ||
       (NAN((float)lastmaterial->PolygonOffsetDepthBias) ||
        NAN((float)material->PolygonOffsetDepthBias))) goto LAB_00200b08;
LAB_00200b9c:
    if (((float)lastmaterial->Thickness != (float)material->Thickness) ||
       (NAN((float)lastmaterial->Thickness) || NAN((float)material->Thickness))) goto LAB_00200bb2;
LAB_00200c09:
    if (lastmaterial->AntiAliasing == material->AntiAliasing) goto LAB_00200c97;
  }
  if (this->field_0x538 == '\x01') {
    if ((material->AntiAliasing & 4) == 0) {
      if ((lastmaterial->AntiAliasing & 4) != 0) {
        glDisable(0x809e);
      }
    }
    else {
      glEnable(0x809e);
    }
    if ((this->AntiAlias < 2) || ((material->AntiAliasing & 3) == 0)) {
      glDisable(0x809d);
    }
    else {
      glEnable(0x809d);
      if (this->field_0x63a == '\x01') {
        if ((~material->AntiAliasing & 3) == 0) {
          uVar11 = 0x1102;
        }
        else {
          uVar11 = 0x1101;
        }
        glHint(0x8534,uVar11);
      }
    }
  }
LAB_00200c97:
  (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x79])
            (this,material,resetAllRenderStates);
  this->FixedPipelineState = local_5c;
  return;
}

Assistant:

void COpenGLDriver::setBasicRenderStates(const SMaterial &material, const SMaterial &lastmaterial,
		bool resetAllRenderStates)
{
	// Fixed pipeline isn't important for shader based materials

	E_OPENGL_FIXED_PIPELINE_STATE tempState = FixedPipelineState;

	if (resetAllRenderStates || tempState == EOFPS_ENABLE || tempState == EOFPS_DISABLE_TO_ENABLE) {
		// material colors
		if (resetAllRenderStates || tempState == EOFPS_DISABLE_TO_ENABLE ||
				lastmaterial.ColorMaterial != material.ColorMaterial) {
			switch (material.ColorMaterial) {
			case ECM_NONE:
				glDisable(GL_COLOR_MATERIAL);
				break;
			case ECM_DIFFUSE:
				glColorMaterial(GL_FRONT_AND_BACK, GL_DIFFUSE);
				break;
			case ECM_AMBIENT:
				glColorMaterial(GL_FRONT_AND_BACK, GL_AMBIENT);
				break;
			case ECM_EMISSIVE:
				glColorMaterial(GL_FRONT_AND_BACK, GL_EMISSION);
				break;
			case ECM_SPECULAR:
				glColorMaterial(GL_FRONT_AND_BACK, GL_SPECULAR);
				break;
			case ECM_DIFFUSE_AND_AMBIENT:
				glColorMaterial(GL_FRONT_AND_BACK, GL_AMBIENT_AND_DIFFUSE);
				break;
			}
			if (material.ColorMaterial != ECM_NONE)
				glEnable(GL_COLOR_MATERIAL);
		}

		if (resetAllRenderStates || tempState == EOFPS_DISABLE_TO_ENABLE ||
				lastmaterial.AmbientColor != material.AmbientColor ||
				lastmaterial.DiffuseColor != material.DiffuseColor ||
				lastmaterial.EmissiveColor != material.EmissiveColor ||
				lastmaterial.ColorMaterial != material.ColorMaterial) {
			GLfloat color[4];

			const f32 inv = 1.0f / 255.0f;

			if ((material.ColorMaterial != video::ECM_AMBIENT) &&
					(material.ColorMaterial != video::ECM_DIFFUSE_AND_AMBIENT)) {
				color[0] = material.AmbientColor.getRed() * inv;
				color[1] = material.AmbientColor.getGreen() * inv;
				color[2] = material.AmbientColor.getBlue() * inv;
				color[3] = material.AmbientColor.getAlpha() * inv;
				glMaterialfv(GL_FRONT_AND_BACK, GL_AMBIENT, color);
			}

			if ((material.ColorMaterial != video::ECM_DIFFUSE) &&
					(material.ColorMaterial != video::ECM_DIFFUSE_AND_AMBIENT)) {
				color[0] = material.DiffuseColor.getRed() * inv;
				color[1] = material.DiffuseColor.getGreen() * inv;
				color[2] = material.DiffuseColor.getBlue() * inv;
				color[3] = material.DiffuseColor.getAlpha() * inv;
				glMaterialfv(GL_FRONT_AND_BACK, GL_DIFFUSE, color);
			}

			if (material.ColorMaterial != video::ECM_EMISSIVE) {
				color[0] = material.EmissiveColor.getRed() * inv;
				color[1] = material.EmissiveColor.getGreen() * inv;
				color[2] = material.EmissiveColor.getBlue() * inv;
				color[3] = material.EmissiveColor.getAlpha() * inv;
				glMaterialfv(GL_FRONT_AND_BACK, GL_EMISSION, color);
			}
		}

		if (resetAllRenderStates || tempState == EOFPS_DISABLE_TO_ENABLE ||
				lastmaterial.SpecularColor != material.SpecularColor ||
				lastmaterial.Shininess != material.Shininess ||
				lastmaterial.ColorMaterial != material.ColorMaterial) {
			GLfloat color[4] = {0.f, 0.f, 0.f, 1.f};
			const f32 inv = 1.0f / 255.0f;

			glMaterialf(GL_FRONT_AND_BACK, GL_SHININESS, material.Shininess);
			// disable Specular colors if no shininess is set
			if ((material.Shininess != 0.0f) &&
					(material.ColorMaterial != video::ECM_SPECULAR)) {
#ifdef GL_EXT_separate_specular_color
				if (FeatureAvailable[IRR_EXT_separate_specular_color])
					glLightModeli(GL_LIGHT_MODEL_COLOR_CONTROL, GL_SEPARATE_SPECULAR_COLOR);
#endif
				color[0] = material.SpecularColor.getRed() * inv;
				color[1] = material.SpecularColor.getGreen() * inv;
				color[2] = material.SpecularColor.getBlue() * inv;
				color[3] = material.SpecularColor.getAlpha() * inv;
			}
#ifdef GL_EXT_separate_specular_color
			else if (FeatureAvailable[IRR_EXT_separate_specular_color])
				glLightModeli(GL_LIGHT_MODEL_COLOR_CONTROL, GL_SINGLE_COLOR);
#endif
			glMaterialfv(GL_FRONT_AND_BACK, GL_SPECULAR, color);
		}

		// shademode
		if (resetAllRenderStates || tempState == EOFPS_DISABLE_TO_ENABLE ||
				lastmaterial.GouraudShading != material.GouraudShading) {
			if (material.GouraudShading)
				glShadeModel(GL_SMOOTH);
			else
				glShadeModel(GL_FLAT);
		}

		// lighting
		if (resetAllRenderStates || tempState == EOFPS_DISABLE_TO_ENABLE ||
				lastmaterial.Lighting != material.Lighting) {
			if (material.Lighting)
				glEnable(GL_LIGHTING);
			else
				glDisable(GL_LIGHTING);
		}

		// fog
		if (resetAllRenderStates || tempState == EOFPS_DISABLE_TO_ENABLE ||
				lastmaterial.FogEnable != material.FogEnable) {
			if (material.FogEnable)
				glEnable(GL_FOG);
			else
				glDisable(GL_FOG);
		}

		// normalization
		if (resetAllRenderStates || tempState == EOFPS_DISABLE_TO_ENABLE ||
				lastmaterial.NormalizeNormals != material.NormalizeNormals) {
			if (material.NormalizeNormals)
				glEnable(GL_NORMALIZE);
			else
				glDisable(GL_NORMALIZE);
		}

		// Set fixed pipeline as active.
		tempState = EOFPS_ENABLE;
	} else if (tempState == EOFPS_ENABLE_TO_DISABLE) {
		glDisable(GL_COLOR_MATERIAL);
		glDisable(GL_LIGHTING);
		glDisable(GL_FOG);
		glDisable(GL_NORMALIZE);

		// Set programmable pipeline as active.
		tempState = EOFPS_DISABLE;
	}

	// tempState == EOFPS_DISABLE - driver doesn't calls functions related to fixed pipeline.

	// fillmode - fixed pipeline call, but it emulate GL_LINES behaviour in rendering, so it stay here.
	if (resetAllRenderStates || (lastmaterial.Wireframe != material.Wireframe) || (lastmaterial.PointCloud != material.PointCloud))
		glPolygonMode(GL_FRONT_AND_BACK, material.Wireframe ? GL_LINE : material.PointCloud ? GL_POINT
																							: GL_FILL);

	// ZBuffer
	switch (material.ZBuffer) {
	case ECFN_DISABLED:
		CacheHandler->setDepthTest(false);
		break;
	case ECFN_LESSEQUAL:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_LEQUAL);
		break;
	case ECFN_EQUAL:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_EQUAL);
		break;
	case ECFN_LESS:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_LESS);
		break;
	case ECFN_NOTEQUAL:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_NOTEQUAL);
		break;
	case ECFN_GREATEREQUAL:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_GEQUAL);
		break;
	case ECFN_GREATER:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_GREATER);
		break;
	case ECFN_ALWAYS:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_ALWAYS);
		break;
	case ECFN_NEVER:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_NEVER);
		break;
	default:
		break;
	}

	// ZWrite
	if (getWriteZBuffer(material)) {
		CacheHandler->setDepthMask(true);
	} else {
		CacheHandler->setDepthMask(false);
	}

	// Back face culling
	if ((material.FrontfaceCulling) && (material.BackfaceCulling)) {
		CacheHandler->setCullFaceFunc(GL_FRONT_AND_BACK);
		CacheHandler->setCullFace(true);
	} else if (material.BackfaceCulling) {
		CacheHandler->setCullFaceFunc(GL_BACK);
		CacheHandler->setCullFace(true);
	} else if (material.FrontfaceCulling) {
		CacheHandler->setCullFaceFunc(GL_FRONT);
		CacheHandler->setCullFace(true);
	} else {
		CacheHandler->setCullFace(false);
	}

	// Color Mask
	CacheHandler->setColorMask(material.ColorMask);

	// Blend Equation
	if (material.BlendOperation == EBO_NONE)
		CacheHandler->setBlend(false);
	else {
		CacheHandler->setBlend(true);

#if defined(GL_EXT_blend_subtract) || defined(GL_EXT_blend_minmax) || defined(GL_EXT_blend_logic_op) || defined(GL_VERSION_1_4)
		if (queryFeature(EVDF_BLEND_OPERATIONS)) {
			switch (material.BlendOperation) {
			case EBO_SUBTRACT:
#if defined(GL_VERSION_1_4)
				CacheHandler->setBlendEquation(GL_FUNC_SUBTRACT);
#elif defined(GL_EXT_blend_subtract)
				CacheHandler->setBlendEquation(GL_FUNC_SUBTRACT_EXT);
#endif
				break;
			case EBO_REVSUBTRACT:
#if defined(GL_VERSION_1_4)
				CacheHandler->setBlendEquation(GL_FUNC_REVERSE_SUBTRACT);
#elif defined(GL_EXT_blend_subtract)
				CacheHandler->setBlendEquation(GL_FUNC_REVERSE_SUBTRACT_EXT);
#endif
				break;
			case EBO_MIN:
#if defined(GL_VERSION_1_4)
				CacheHandler->setBlendEquation(GL_MIN);
#elif defined(GL_EXT_blend_minmax)
				CacheHandler->setBlendEquation(GL_MIN_EXT);
#endif
				break;
			case EBO_MAX:
#if defined(GL_VERSION_1_4)
				CacheHandler->setBlendEquation(GL_MAX);
#elif defined(GL_EXT_blend_minmax)
				CacheHandler->setBlendEquation(GL_MAX_EXT);
#endif
				break;
			case EBO_MIN_FACTOR:
#if defined(GL_AMD_blend_minmax_factor)
				if (FeatureAvailable[IRR_AMD_blend_minmax_factor])
					CacheHandler->setBlendEquation(GL_FACTOR_MIN_AMD);
#endif
					// fallback in case of missing extension
#if defined(GL_VERSION_1_4)
#if defined(GL_AMD_blend_minmax_factor)
				else
#endif
					CacheHandler->setBlendEquation(GL_MIN);
#endif
				break;
			case EBO_MAX_FACTOR:
#if defined(GL_AMD_blend_minmax_factor)
				if (FeatureAvailable[IRR_AMD_blend_minmax_factor])
					CacheHandler->setBlendEquation(GL_FACTOR_MAX_AMD);
#endif
					// fallback in case of missing extension
#if defined(GL_VERSION_1_4)
#if defined(GL_AMD_blend_minmax_factor)
				else
#endif
					CacheHandler->setBlendEquation(GL_MAX);
#endif
				break;
			case EBO_MIN_ALPHA:
#if defined(GL_SGIX_blend_alpha_minmax)
				if (FeatureAvailable[IRR_SGIX_blend_alpha_minmax])
					CacheHandler->setBlendEquation(GL_ALPHA_MIN_SGIX);
				// fallback in case of missing extension
				else if (FeatureAvailable[IRR_EXT_blend_minmax])
					CacheHandler->setBlendEquation(GL_MIN_EXT);
#endif
				break;
			case EBO_MAX_ALPHA:
#if defined(GL_SGIX_blend_alpha_minmax)
				if (FeatureAvailable[IRR_SGIX_blend_alpha_minmax])
					CacheHandler->setBlendEquation(GL_ALPHA_MAX_SGIX);
				// fallback in case of missing extension
				else if (FeatureAvailable[IRR_EXT_blend_minmax])
					CacheHandler->setBlendEquation(GL_MAX_EXT);
#endif
				break;
			default:
#if defined(GL_VERSION_1_4)
				CacheHandler->setBlendEquation(GL_FUNC_ADD);
#elif defined(GL_EXT_blend_subtract) || defined(GL_EXT_blend_minmax) || defined(GL_EXT_blend_logic_op)
				CacheHandler->setBlendEquation(GL_FUNC_ADD_EXT);
#endif
				break;
			}
		}
#endif
	}

	// Blend Factor
	if (IR(material.BlendFactor) & 0xFFFFFFFF // TODO: why the & 0xFFFFFFFF?
			&& material.MaterialType != EMT_ONETEXTURE_BLEND) {
		E_BLEND_FACTOR srcRGBFact = EBF_ZERO;
		E_BLEND_FACTOR dstRGBFact = EBF_ZERO;
		E_BLEND_FACTOR srcAlphaFact = EBF_ZERO;
		E_BLEND_FACTOR dstAlphaFact = EBF_ZERO;
		E_MODULATE_FUNC modulo = EMFN_MODULATE_1X;
		u32 alphaSource = 0;

		unpack_textureBlendFuncSeparate(srcRGBFact, dstRGBFact, srcAlphaFact, dstAlphaFact, modulo, alphaSource, material.BlendFactor);

		if (queryFeature(EVDF_BLEND_SEPARATE)) {
			CacheHandler->setBlendFuncSeparate(getGLBlend(srcRGBFact), getGLBlend(dstRGBFact),
					getGLBlend(srcAlphaFact), getGLBlend(dstAlphaFact));
		} else {
			CacheHandler->setBlendFunc(getGLBlend(srcRGBFact), getGLBlend(dstRGBFact));
		}
	}

	// Polygon Offset
	if (queryFeature(EVDF_POLYGON_OFFSET) && (resetAllRenderStates ||
													 lastmaterial.PolygonOffsetSlopeScale != material.PolygonOffsetSlopeScale ||
													 lastmaterial.PolygonOffsetDepthBias != material.PolygonOffsetDepthBias)) {
		glDisable(lastmaterial.Wireframe ? GL_POLYGON_OFFSET_LINE : lastmaterial.PointCloud ? GL_POLYGON_OFFSET_POINT
																							: GL_POLYGON_OFFSET_FILL);
		if (material.PolygonOffsetSlopeScale || material.PolygonOffsetDepthBias) {
			glEnable(material.Wireframe ? GL_POLYGON_OFFSET_LINE : material.PointCloud ? GL_POLYGON_OFFSET_POINT
																					   : GL_POLYGON_OFFSET_FILL);

			glPolygonOffset(material.PolygonOffsetSlopeScale, material.PolygonOffsetDepthBias);
		} else {
			glPolygonOffset(0.0f, 0.f);
		}
	}

	// thickness
	if (resetAllRenderStates || lastmaterial.Thickness != material.Thickness) {
		if (AntiAlias) {
			//			glPointSize(core::clamp(static_cast<GLfloat>(material.Thickness), DimSmoothedPoint[0], DimSmoothedPoint[1]));
			// we don't use point smoothing
			glPointSize(core::clamp(static_cast<GLfloat>(material.Thickness), DimAliasedPoint[0], DimAliasedPoint[1]));
			glLineWidth(core::clamp(static_cast<GLfloat>(material.Thickness), DimSmoothedLine[0], DimSmoothedLine[1]));
		} else {
			glPointSize(core::clamp(static_cast<GLfloat>(material.Thickness), DimAliasedPoint[0], DimAliasedPoint[1]));
			glLineWidth(core::clamp(static_cast<GLfloat>(material.Thickness), DimAliasedLine[0], DimAliasedLine[1]));
		}
	}

	// Anti aliasing
	if ((resetAllRenderStates || lastmaterial.AntiAliasing != material.AntiAliasing) && FeatureAvailable[IRR_ARB_multisample]) {
		if (material.AntiAliasing & EAAM_ALPHA_TO_COVERAGE)
			glEnable(GL_SAMPLE_ALPHA_TO_COVERAGE_ARB);
		else if (lastmaterial.AntiAliasing & EAAM_ALPHA_TO_COVERAGE)
			glDisable(GL_SAMPLE_ALPHA_TO_COVERAGE_ARB);

		if ((AntiAlias >= 2) && (material.AntiAliasing & (EAAM_SIMPLE | EAAM_QUALITY))) {
			glEnable(GL_MULTISAMPLE_ARB);
#ifdef GL_NV_multisample_filter_hint
			if (FeatureAvailable[IRR_NV_multisample_filter_hint]) {
				if ((material.AntiAliasing & EAAM_QUALITY) == EAAM_QUALITY)
					glHint(GL_MULTISAMPLE_FILTER_HINT_NV, GL_NICEST);
				else
					glHint(GL_MULTISAMPLE_FILTER_HINT_NV, GL_FASTEST);
			}
#endif
		} else
			glDisable(GL_MULTISAMPLE_ARB);
	}

	// Texture parameters
	setTextureRenderStates(material, resetAllRenderStates);

	// set current fixed pipeline state
	FixedPipelineState = tempState;
}